

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void TableSettingsInit(ImGuiTableSettings *settings,ImGuiID id,int columns_count,
                      int columns_count_max)

{
  ImGuiTableColumnSettings *this;
  int in_ECX;
  ImGuiTableColumnIdx in_DL;
  ImGuiID in_ESI;
  ImGuiTableSettings *in_RDI;
  int n;
  ImGuiTableColumnSettings *settings_column;
  int local_34;
  
  operator_new(0x10);
  ImGuiTableSettings::ImGuiTableSettings((ImGuiTableSettings *)0x2439b9);
  ImGuiTableSettings::GetColumnSettings(in_RDI);
  for (local_34 = 0; local_34 < in_ECX; local_34 = local_34 + 1) {
    this = (ImGuiTableColumnSettings *)operator_new(0xc);
    ImGuiTableColumnSettings::ImGuiTableColumnSettings(this);
  }
  in_RDI->ID = in_ESI;
  in_RDI->ColumnsCount = in_DL;
  in_RDI->ColumnsCountMax = (ImGuiTableColumnIdx)in_ECX;
  in_RDI->WantApply = true;
  return;
}

Assistant:

static void TableSettingsInit(ImGuiTableSettings* settings, ImGuiID id, int columns_count, int columns_count_max)
{
    IM_PLACEMENT_NEW(settings) ImGuiTableSettings();
    ImGuiTableColumnSettings* settings_column = settings->GetColumnSettings();
    for (int n = 0; n < columns_count_max; n++, settings_column++)
        IM_PLACEMENT_NEW(settings_column) ImGuiTableColumnSettings();
    settings->ID = id;
    settings->ColumnsCount = (ImGuiTableColumnIdx)columns_count;
    settings->ColumnsCountMax = (ImGuiTableColumnIdx)columns_count_max;
    settings->WantApply = true;
}